

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O0

int __thiscall
icu_63::IslamicCalendar::clone
          (IslamicCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  IslamicCalendar *this_00;
  undefined8 local_30;
  IslamicCalendar *this_local;
  
  this_00 = (IslamicCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)__fn);
  local_30 = (IslamicCalendar *)0x0;
  if (this_00 != (IslamicCalendar *)0x0) {
    IslamicCalendar(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Calendar* IslamicCalendar::clone() const {
    return new IslamicCalendar(*this);
}